

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StyleSheetFactory.cpp
# Opt level: O1

void __thiscall Rml::StyleSheetFactory::StyleSheetFactory(StyleSheetFactory *this)

{
  size_t *psVar1;
  long lVar2;
  long *plVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::StructuralSelectorType>
  local_230;
  undefined1 *local_208 [2];
  undefined1 local_1f8 [16];
  undefined4 local_1e8;
  undefined1 *local_1e0 [2];
  undefined1 local_1d0 [16];
  undefined4 local_1c0;
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [16];
  undefined4 local_198;
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  undefined4 local_170;
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  undefined4 local_148;
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  undefined4 local_120;
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  undefined4 local_f8;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined4 local_d0;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined4 local_a8;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined4 local_80;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined4 local_58;
  long *local_50 [2];
  long local_40 [2];
  undefined4 local_30;
  
  psVar1 = &(this->stylesheets).mMask;
  (this->stylesheets).mKeyVals = (Node *)psVar1;
  (this->stylesheets).mInfo = (uint8_t *)psVar1;
  (this->stylesheets).mNumElements = 0;
  (this->stylesheets).mMask = 0;
  (this->stylesheets).mMaxNumElementsAllowed = 0;
  (this->stylesheets).mInfoInc = 0x20;
  (this->stylesheets).mInfoHashShift = 0;
  local_230.first._M_dataplus._M_p = (pointer)&local_230.first.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"nth-child","");
  local_230.second = Nth_Child;
  local_208[0] = local_1f8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"nth-last-child","");
  local_1e8 = 2;
  local_1e0[0] = local_1d0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"nth-of-type","");
  local_1c0 = 3;
  local_1b8[0] = local_1a8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"nth-last-of-type","");
  local_198 = 4;
  local_190[0] = local_180;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"first-child","");
  local_170 = 5;
  local_168[0] = local_158;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"last-child","");
  local_148 = 6;
  local_140[0] = local_130;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"first-of-type","");
  local_120 = 7;
  local_118[0] = local_108;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"last-of-type","");
  local_f8 = 8;
  local_f0[0] = local_e0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"only-child","");
  local_d0 = 9;
  local_c8[0] = local_b8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"only-of-type","");
  local_a8 = 10;
  local_a0[0] = local_90;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"empty","");
  local_80 = 0xb;
  local_78[0] = local_68;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"not","");
  local_58 = 0xc;
  plVar3 = local_40;
  local_50[0] = plVar3;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"scope","");
  local_30 = 0xd;
  psVar1 = &(this->selectors).mMask;
  (this->selectors).mKeyVals = (Node *)psVar1;
  (this->selectors).mInfo = (uint8_t *)psVar1;
  (this->selectors).mNumElements = 0;
  (this->selectors).mMask = 0;
  (this->selectors).mMaxNumElementsAllowed = 0;
  (this->selectors).mInfoInc = 0x20;
  (this->selectors).mInfoHashShift = 0;
  robin_hood::detail::
  Table<true,80ul,std::__cxx11::string,Rml::StructuralSelectorType,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
  ::insert<robin_hood::pair<std::__cxx11::string,Rml::StructuralSelectorType>const*>
            ((Table<true,80ul,std::__cxx11::string,Rml::StructuralSelectorType,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
              *)&this->selectors,&local_230,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::StructuralSelectorType>
              *)&stack0xffffffffffffffd8);
  lVar2 = -0x208;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -5;
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0);
  return;
}

Assistant:

StyleSheetFactory::StyleSheetFactory() :
	selectors{
		{"nth-child", StructuralSelectorType::Nth_Child},
		{"nth-last-child", StructuralSelectorType::Nth_Last_Child},
		{"nth-of-type", StructuralSelectorType::Nth_Of_Type},
		{"nth-last-of-type", StructuralSelectorType::Nth_Last_Of_Type},
		{"first-child", StructuralSelectorType::First_Child},
		{"last-child", StructuralSelectorType::Last_Child},
		{"first-of-type", StructuralSelectorType::First_Of_Type},
		{"last-of-type", StructuralSelectorType::Last_Of_Type},
		{"only-child", StructuralSelectorType::Only_Child},
		{"only-of-type", StructuralSelectorType::Only_Of_Type},
		{"empty", StructuralSelectorType::Empty},
		{"not", StructuralSelectorType::Not},
		{"scope", StructuralSelectorType::Scope},
	}
{}